

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::DebugCheckInvariants(SparseArray<re2::NFA::Thread_*> *this)

{
  int iVar1;
  
  iVar1 = this->size_;
  if (iVar1 < 0) {
    __assert_fail("(0) <= (size_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c4,
                  "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
                 );
  }
  if (iVar1 <= this->max_size_) {
    if ((iVar1 != 0) && (this->sparse_to_dense_ == (int *)0x0)) {
      __assert_fail("size_ == 0 || sparse_to_dense_ != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                    ,0x1c6,
                    "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
                   );
    }
    return;
  }
  __assert_fail("(size_) <= (max_size_)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x1c5,
                "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
               );
}

Assistant:

void SparseArray<Value>::DebugCheckInvariants() const {
  DCHECK_LE(0, size_);
  DCHECK_LE(size_, max_size_);
  DCHECK(size_ == 0 || sparse_to_dense_ != NULL);
}